

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusPoly.cpp
# Opt level: O1

ModulusPoly * __thiscall
ZXing::Pdf417::ModulusPoly::negative(ModulusPoly *__return_storage_ptr__,ModulusPoly *this)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  ModulusGF *pMVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  size_type __n;
  vector<int,_std::allocator<int>_> negativeCoefficients;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> local_40;
  
  piVar2 = (this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)piVar2 - (long)piVar3 >> 2;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__n,&local_41);
  if (piVar2 != piVar3) {
    pMVar4 = this->_field;
    piVar2 = (this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      iVar6 = piVar2[lVar5];
      iVar1 = pMVar4->_modulus;
      iVar7 = iVar1 - iVar6;
      iVar6 = -iVar6;
      if (iVar7 < iVar1) {
        iVar6 = iVar7;
      }
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5] = iVar6;
      lVar5 = lVar5 + 1;
    } while (__n + (__n == 0) != lVar5);
  }
  ModulusPoly(__return_storage_ptr__,this->_field,&local_40);
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ModulusPoly
ModulusPoly::negative() const
{
	size_t size = _coefficients.size();
	std::vector<int> negativeCoefficients(size);
	for (size_t i = 0; i < size; i++) {
		negativeCoefficients[i] = _field->subtract(0, _coefficients[i]);
	}
	return ModulusPoly(*_field, negativeCoefficients);
}